

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyFlat
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix,uint segmentCount)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  Reader RStack_48;
  
  pbVar4 = prefix.ptr;
  if (prefix.size_ < 8) {
    return PLAUSIBLE;
  }
  if ((*pbVar4 & 3) != 0) {
    if ((*pbVar4 & 3) != 2) {
      return IMPOSSIBLE;
    }
    if (*(uint *)(pbVar4 + 4) == 0) {
      return IMPOSSIBLE;
    }
    return (uint)(*(uint *)(pbVar4 + 4) < segmentCount) * 3;
  }
  if ((char)pbVar4[3] < '\0') {
    return IMPOSSIBLE;
  }
  if (0x1f < pbVar4[3]) {
    return IMPLAUSIBLE;
  }
  uVar1 = *(ushort *)(pbVar4 + 4);
  uVar2 = *(ushort *)(pbVar4 + 6);
  if (0x800 < (uint)uVar2 + (uint)uVar1) {
    return IMPLAUSIBLE;
  }
  Schema::getProto(&RStack_48,&(this->rootType).super_Schema);
  uVar3 = 0;
  uVar6 = (uint)uVar1;
  uVar5 = (uint)uVar2;
  if (0x7f < RStack_48._reader.dataSize) {
    if (uVar6 < *(ushort *)((long)RStack_48._reader.data + 0xe)) {
      uVar3 = 0;
      if (0xcf < RStack_48._reader.dataSize) {
        uVar3 = (uint)*(ushort *)((long)RStack_48._reader.data + 0x18);
      }
      if (uVar3 < uVar5) {
        return WRONG_TYPE;
      }
    }
    uVar3 = (uint)*(ushort *)((long)RStack_48._reader.data + 0xe);
  }
  if (RStack_48._reader.dataSize < 0xd0 || uVar6 <= uVar3) {
    if (0x7f < RStack_48._reader.dataSize) goto LAB_0011ff25;
    uVar3 = 0;
    if (uVar6 != 0) goto LAB_0011ff2e;
  }
  else {
    if (uVar5 < *(ushort *)((long)RStack_48._reader.data + 0x18)) {
      return WRONG_TYPE;
    }
LAB_0011ff25:
    uVar3 = (uint)*(ushort *)((long)RStack_48._reader.data + 0xe);
    if (*(ushort *)((long)RStack_48._reader.data + 0xe) < uVar6) {
LAB_0011ff2e:
      if (0x80 < uVar6 - uVar3) {
        return WRONG_TYPE;
      }
    }
    if (0xcf < RStack_48._reader.dataSize) {
      uVar3 = (uint)*(ushort *)((long)RStack_48._reader.data + 0x18);
      if (uVar5 <= *(ushort *)((long)RStack_48._reader.data + 0x18)) {
        return PLAUSIBLE;
      }
      goto LAB_0011ff59;
    }
  }
  uVar3 = 0;
  if (uVar5 == 0) {
    return PLAUSIBLE;
  }
LAB_0011ff59:
  if (uVar5 - uVar3 < 0x81) {
    return PLAUSIBLE;
  }
  return WRONG_TYPE;
}

Assistant:

Plausibility isPlausiblyFlat(kj::ArrayPtr<const byte> prefix, uint segmentCount = 1) {
    if (prefix.size() < 8) {
      // Not enough prefix to say.
      return PLAUSIBLE;
    }

    if ((prefix[0] & 3) == 2) {
      // Far pointer.  Verify the segment ID.
      uint32_t segmentId = prefix[4] | (prefix[5] << 8)
                         | (prefix[6] << 16) | (prefix[7] << 24);
      if (segmentId == 0 || segmentId >= segmentCount) {
        return IMPOSSIBLE;
      } else {
        return PLAUSIBLE;
      }
    }

    if ((prefix[0] & 3) != 0) {
      // Not a struct pointer.
      return IMPOSSIBLE;
    }
    if ((prefix[3] & 0x80) != 0) {
      if (prefix[0] == 0xff && prefix[1] == 0xff && prefix[2] == 0xff && prefix[3] == 0xff &&
          prefix[4] == 0    && prefix[5] == 0    && prefix[6] == 0    && prefix[7] == 0) {
        // This is an empty struct with offset of -1. That's valid.
      } else {
        // Offset is negative (invalid).
        return IMPOSSIBLE;
      }
    }
    if ((prefix[3] & 0xe0) != 0) {
      // Offset is over a gigabyte (implausible).
      return IMPLAUSIBLE;
    }

    uint data = prefix[4] | (prefix[5] << 8);
    uint pointers = prefix[6] | (prefix[7] << 8);

    if (data + pointers > 2048) {
      // Root struct is huge (over 16 KiB).
      return IMPLAUSIBLE;
    }

    auto structSchema = rootType.getProto().getStruct();
    if ((data < structSchema.getDataWordCount() && pointers > structSchema.getPointerCount()) ||
        (data > structSchema.getDataWordCount() && pointers < structSchema.getPointerCount())) {
      // Struct is neither older nor newer than the schema.
      return WRONG_TYPE;
    }

    if (data > structSchema.getDataWordCount() &&
        data - structSchema.getDataWordCount() > 128) {
      // Data section appears to have grown by 1k (128 words).  This seems implausible.
      return WRONG_TYPE;
    }
    if (pointers > structSchema.getPointerCount() &&
        pointers - structSchema.getPointerCount() > 128) {
      // Pointer section appears to have grown by 1k (128 words).  This seems implausible.
      return WRONG_TYPE;
    }

    return PLAUSIBLE;
  }